

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O0

void select_transform(JXFORM_CODE transform)

{
  JXFORM_CODE JVar1;
  JXFORM_CODE in_EDI;
  
  JVar1 = in_EDI;
  if ((transformoption.transform != JXFORM_NONE) &&
     (JVar1 = in_EDI, transformoption.transform != in_EDI)) {
    fprintf(_stderr,"%s: can only do one image transformation at a time\n",progname);
    usage();
    JVar1 = transformoption.transform;
  }
  transformoption.transform = JVar1;
  return;
}

Assistant:

LOCAL(void)
select_transform(JXFORM_CODE transform)
/* Silly little routine to detect multiple transform options,
 * which we can't handle.
 */
{
#if TRANSFORMS_SUPPORTED
  if (transformoption.transform == JXFORM_NONE ||
      transformoption.transform == transform) {
    transformoption.transform = transform;
  } else {
    fprintf(stderr, "%s: can only do one image transformation at a time\n",
            progname);
    usage();
  }
#else
  fprintf(stderr, "%s: sorry, image transformation was not compiled\n",
          progname);
  exit(EXIT_FAILURE);
#endif
}